

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDemo.c
# Opt level: O2

void RDL_demo_output(RDL_data *URFdata)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  RDL_cycle **cycleArray;
  RDL_edge *bondArray;
  uint local_44;
  char **otherCycleArray;
  RDL_node *atoms;
  
  uVar1 = RDL_getNofURF(URFdata);
  puts("==========================================================URF=");
  printf("Number of Unique Ring Families: %d\n\n",(ulong)uVar1);
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = RDL_getWeightForURF(URFdata,uVar5);
    printf("URF %d has weight %d.\n",(ulong)uVar5,(ulong)uVar2);
  }
  puts("\n===============================================================");
  puts("The rest of this output might depend on the order of the input:\n");
  uVar4 = 0;
  while (uVar5 = (uint)uVar4, uVar1 != uVar5) {
    uVar2 = RDL_getEdgesForURF(URFdata,uVar5,&bondArray);
    printf("There are %d bonds in URF %d.\n",(ulong)uVar2,uVar4);
    free(bondArray);
    uVar4 = (ulong)(uVar5 + 1);
  }
  putchar(10);
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    printf("Atoms in URF %d: ",(ulong)uVar5);
    uVar2 = RDL_getNodesForURF(URFdata,uVar5,&atoms);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      printf("%d ",(ulong)atoms[uVar4]);
    }
    putchar(10);
    free(atoms);
  }
  putchar(10);
  printf("A possible MCB (SSSR) ");
  uVar1 = RDL_getSSSR(URFdata,&cycleArray);
  printf("(%d rings):\n",(ulong)uVar1);
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    printf("ring %d: ",uVar4 & 0xffffffff);
    uVar6 = 0;
    while( true ) {
      if (cycleArray[uVar4]->weight <= uVar6) break;
      printf("(%d ",(ulong)cycleArray[uVar4]->edges[uVar6][0]);
      printf("%d), ",(ulong)cycleArray[uVar4]->edges[uVar6][1]);
      uVar6 = uVar6 + 1;
    }
    putchar(10);
  }
  RDL_deleteCycles(cycleArray,uVar1);
  putchar(10);
  printf("The RC Prototypes with bonds as pairs of atoms ");
  uVar1 = RDL_getRCPrototypes(URFdata,&cycleArray);
  printf("(%d rings):\n",(ulong)uVar1);
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    printf("ring %d: ",uVar4 & 0xffffffff);
    uVar6 = 0;
    while( true ) {
      if (cycleArray[uVar4]->weight <= uVar6) break;
      printf("(%d ",(ulong)cycleArray[uVar4]->edges[uVar6][0]);
      printf("%d), ",(ulong)cycleArray[uVar4]->edges[uVar6][1]);
      uVar6 = uVar6 + 1;
    }
    putchar(10);
  }
  putchar(10);
  printf("The RC Prototypes as vectors ");
  uVar1 = RDL_translateCycArray(URFdata,cycleArray,uVar1,&otherCycleArray);
  printf("(%d rings):\n",(ulong)uVar1);
  uVar5 = RDL_getEdgeArray(URFdata,&bondArray);
  printf("Edge from");
  uVar4 = (ulong)uVar5;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    printf("%2d",(ulong)bondArray[uVar6][0]);
  }
  printf("\n     to  ");
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    printf("%2d",(ulong)bondArray[uVar6][1]);
  }
  putchar(10);
  free(bondArray);
  local_44 = uVar1;
  for (uVar6 = 0; uVar5 = local_44, uVar6 != uVar1; uVar6 = uVar6 + 1) {
    printf("ring %3d: ",uVar6 & 0xffffffff);
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      printf("%d ",(ulong)(uint)(int)otherCycleArray[uVar6][uVar3]);
    }
    putchar(10);
  }
  RDL_deleteCycles(cycleArray,local_44);
  RDL_deleteEdgeIdxArray(otherCycleArray,uVar5);
  puts("==========================================================URF=");
  return;
}

Assistant:

void RDL_demo_output(RDL_data* URFdata)
{
  unsigned URFcount, idx, count, obIdx, edgeCount;
  RDL_edge *bondArray;
  RDL_node *atoms;
  RDL_cycle **cycleArray;
  char **otherCycleArray;

  /* some output */
  URFcount = RDL_getNofURF(URFdata);
  printf("==========================================================URF=\n");
  printf("Number of Unique Ring Families: %d\n\n", URFcount);
  for(idx=0; idx<URFcount; ++idx)
  {
    printf("URF %d has weight %d.\n", idx, RDL_getWeightForURF(URFdata, idx));
  }
  /* some more output which might change when the order of the input is changed*/
  printf("\n===============================================================\n");
  printf("The rest of this output might depend on the order of the input:\n\n");
  for(idx=0; idx<URFcount; ++idx)
  {
      count = RDL_getEdgesForURF(URFdata, idx, &bondArray);
      printf("There are %d bonds in URF %d.\n", count, idx);
      free(bondArray);
  }
  printf("\n");

  for(idx=0; idx<URFcount; ++idx)
  {
      printf("Atoms in URF %d: ",idx);
      count = RDL_getNodesForURF(URFdata, idx, &atoms);
      for(obIdx=0; obIdx<count; ++obIdx)
      {
          printf("%d ",atoms[obIdx]);
      }
      printf("\n");
      free(atoms);
  }
  printf("\n");

  printf("A possible MCB (SSSR) ");
  count = RDL_getSSSR(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight;  ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  printf("\n");

  printf("The RC Prototypes with bonds as pairs of atoms ");
  count = RDL_getRCPrototypes(URFdata, &cycleArray);
  printf("(%d rings):\n",count);
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %d: ",idx);
      for(obIdx=0; obIdx<cycleArray[idx]->weight; ++obIdx)
      {
          printf("(%d ",cycleArray[idx]->edges[obIdx][0]);
          printf("%d), ",cycleArray[idx]->edges[obIdx][1]);
      }
      printf("\n");
  }
  printf("\n");

  printf("The RC Prototypes as vectors ");
  count = RDL_translateCycArray(URFdata, cycleArray, count, &otherCycleArray);
  printf("(%d rings):\n",count);
  /* To be able to understand the bitsets better: */
  edgeCount = RDL_getEdgeArray(URFdata, &bondArray);
  printf("Edge from");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][0]);
  }
  printf("\n     to  ");
  for(idx=0; idx<edgeCount; ++idx)
  {
      printf("%2d",bondArray[idx][1]);
  }
  printf("\n");
  free(bondArray);
  /* the bitsets: */
  for(idx=0; idx<count; ++idx)
  {
      printf("ring %3d: ",idx);
      for(obIdx=0; obIdx<edgeCount; ++obIdx)
      {
          printf("%d ",otherCycleArray[idx][obIdx]);
      }
      printf("\n");
  }
  RDL_deleteCycles(cycleArray, count);
  RDL_deleteEdgeIdxArray(otherCycleArray, count);
  printf("==========================================================URF=\n");
}